

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
bk_lib::
pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>::
reserve(pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
        *this,size_type n)

{
  pointer pAVar1;
  AtomNode *__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<Clasp::Asp::PrgDepGraph::AtomNode>::allocate
                       ((new_allocator<Clasp::Asp::PrgDepGraph::AtomNode> *)this,(ulong)n,
                        (void *)0x0);
    pAVar1 = (this->ebo_).buf;
    if (pAVar1 != (pointer)0x0) {
      memcpy(__dest,pAVar1,(ulong)(this->ebo_).size * 0x18);
      pAVar1 = (this->ebo_).buf;
      if (pAVar1 != (pointer)0x0) {
        operator_delete(pAVar1);
      }
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}